

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cpp
# Opt level: O1

GlobRank __thiscall
slang::svGlob(slang *this,path *basePath,string_view pattern,GlobMode mode,
             SmallVector<std::filesystem::__cxx11::path,_2UL> *results,bool expandEnvVars,
             error_code *ec)

{
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var1;
  _List _Var2;
  size_type sVar3;
  char cVar4;
  int iVar5;
  GlobRank GVar6;
  size_type sVar7;
  _Alloc_hider _Var8;
  int iVar9;
  undefined4 uVar10;
  path *p;
  path *ppVar11;
  path *ppVar12;
  path *ctx;
  undefined4 in_register_00000084;
  SmallVectorBase<std::filesystem::__cxx11::path> *this_00;
  char **ptr;
  size_type __rlen;
  long lVar13;
  bool bVar14;
  string_view pattern_00;
  string_view pattern_01;
  bool anyWildcards;
  undefined7 in_stack_00000009;
  path patternPath;
  string patternStr;
  error_code localEc;
  SmallVector<std::filesystem::__cxx11::path,_2UL> local;
  uint in_stack_fffffffffffffec8;
  undefined1 local_128 [32];
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> local_108;
  path local_100;
  path *local_d8;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  path local_c0;
  undefined1 local_98 [24];
  path local_80 [2];
  
  this_00 = (SmallVectorBase<std::filesystem::__cxx11::path> *)CONCAT44(in_register_00000084,mode);
  iVar9 = (int)pattern._M_str;
  ppVar12 = (path *)CONCAT71(in_stack_00000009,expandEnvVars);
  local_d8 = (path *)this;
  local_d0._M_len = (size_t)basePath;
  local_d0._M_str = (char *)pattern._M_len;
  sVar7 = std::_V2::system_category();
  *(undefined4 *)&(ppVar12->_M_pathname)._M_dataplus._M_p = 0;
  (ppVar12->_M_pathname)._M_string_length = sVar7;
  if (basePath == (path *)0x1) {
    iVar5 = bcmp((char **)pattern._M_len,"-",1);
    bVar14 = iVar5 == 0;
  }
  else {
    bVar14 = false;
  }
  if ((iVar9 == 0) && (bVar14)) {
    SmallVectorBase<std::filesystem::__cxx11::path>::emplace_back<char_const(&)[2]>
              (this_00,(char (*) [2])0x4b3494);
    return ExactPath;
  }
  std::filesystem::__cxx11::path::path((path *)local_128);
  if ((char)results == '\0') {
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              ((path *)local_98,&local_d0,auto_format);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
    sVar3 = local_80[0]._M_pathname._M_string_length;
    _Var1._M_head_impl = local_108._M_head_impl;
    local_80[0]._M_pathname._M_string_length = 0;
    local_108._M_head_impl = (_Impl *)sVar3;
    if (_Var1._M_head_impl != (_Impl *)0x0) {
      std::filesystem::__cxx11::path::_List::_Impl_deleter::operator()
                ((_Impl_deleter *)&local_108,_Var1._M_head_impl);
    }
    std::filesystem::__cxx11::path::clear((path *)local_98);
    std::filesystem::__cxx11::path::~path((path *)local_98);
  }
  else {
    local_100._M_pathname._M_dataplus._M_p = (pointer)&local_100._M_pathname.field_2;
    local_100._M_pathname._M_string_length = 0;
    local_100._M_pathname.field_2._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
              (&local_100._M_pathname,local_d0._M_len);
    local_c0._M_pathname._M_dataplus._M_p = local_d0._M_str;
    if ((path *)local_d0._M_len != (path *)0x0) {
      ptr = (char **)((long)&(((string_type *)local_d0._M_len)->_M_dataplus)._M_p +
                     (long)local_d0._M_str);
      _Var8._M_p = local_d0._M_str;
      do {
        local_c0._M_pathname._M_dataplus._M_p = _Var8._M_p + 1;
        cVar4 = *_Var8._M_p;
        if ((char **)local_c0._M_pathname._M_dataplus._M_p == ptr || cVar4 != '$') {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&local_100._M_pathname,cVar4);
        }
        else {
          OS::parseEnvVar_abi_cxx11_
                    ((string *)local_98,(OS *)&local_c0,ptr,
                     (char *)CONCAT71((int7)((ulong)local_c0._M_pathname._M_dataplus._M_p >> 8),
                                      (char **)local_c0._M_pathname._M_dataplus._M_p == ptr ||
                                      cVar4 != '$'));
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_100._M_pathname,(char *)local_98._0_8_,local_98._8_8_);
          if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
            operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
          }
        }
        _Var8._M_p = local_c0._M_pathname._M_dataplus._M_p;
      } while ((char **)local_c0._M_pathname._M_dataplus._M_p != ptr);
    }
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)local_98,&local_100._M_pathname,auto_format);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
    sVar3 = local_80[0]._M_pathname._M_string_length;
    _Var1._M_head_impl = local_108._M_head_impl;
    local_80[0]._M_pathname._M_string_length = 0;
    local_108._M_head_impl = (_Impl *)sVar3;
    if ((__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
         )_Var1._M_head_impl !=
        (tuple<std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         )0x0) {
      std::filesystem::__cxx11::path::_List::_Impl_deleter::operator()
                ((_Impl_deleter *)&local_108,_Var1._M_head_impl);
    }
    std::filesystem::__cxx11::path::clear((path *)local_98);
    std::filesystem::__cxx11::path::~path((path *)local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_pathname._M_dataplus._M_p != &local_100._M_pathname.field_2) {
      operator_delete(local_100._M_pathname._M_dataplus._M_p,
                      CONCAT71(local_100._M_pathname.field_2._M_allocated_capacity._1_7_,
                               local_100._M_pathname.field_2._M_local_buf[0]) + 1);
    }
    ppVar12 = (path *)CONCAT71(in_stack_00000009,expandEnvVars);
  }
  std::filesystem::__cxx11::path::lexically_normal();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  sVar3 = local_80[0]._M_pathname._M_string_length;
  _Var1._M_head_impl = local_108._M_head_impl;
  local_80[0]._M_pathname._M_string_length = 0;
  local_108._M_head_impl = (_Impl *)sVar3;
  if ((__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
       )_Var1._M_head_impl !=
      (tuple<std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       )0x0) {
    std::filesystem::__cxx11::path::_List::_Impl_deleter::operator()
              ((_Impl_deleter *)&local_108,_Var1._M_head_impl);
  }
  std::filesystem::__cxx11::path::clear((path *)local_98);
  std::filesystem::__cxx11::path::~path((path *)local_98);
  local_98._0_8_ = local_80;
  local_98._8_8_ = (path *)0x0;
  local_98._16_8_ = 2;
  in_stack_fffffffffffffec8 = in_stack_fffffffffffffec8 & 0xffffff;
  cVar4 = std::filesystem::__cxx11::path::has_root_path();
  if (cVar4 == '\0') {
    pattern_01._M_str._0_4_ = iVar9;
    pattern_01._M_len = local_128._0_8_;
    pattern_01._M_str._4_4_ = 0;
    GVar6 = svGlobInternal((slang *)local_d8,(path *)local_128._8_8_,pattern_01,(GlobMode)local_98,
                           (SmallVector<std::filesystem::__cxx11::path,_2UL> *)
                           &stack0xfffffffffffffecb,
                           (bool *)CONCAT44(iVar9,in_stack_fffffffffffffec8));
  }
  else {
    std::filesystem::__cxx11::path::root_path();
    std::filesystem::__cxx11::path::relative_path();
    pattern_00._M_str._0_4_ = iVar9;
    pattern_00._M_len = (size_t)local_c0._M_pathname._M_dataplus._M_p;
    pattern_00._M_str._4_4_ = 0;
    GVar6 = svGlobInternal((slang *)&local_100,(path *)local_c0._M_pathname._M_string_length,
                           pattern_00,(GlobMode)local_98,
                           (SmallVector<std::filesystem::__cxx11::path,_2UL> *)
                           &stack0xfffffffffffffecb,
                           (bool *)CONCAT44(iVar9,in_stack_fffffffffffffec8));
    std::filesystem::__cxx11::path::~path(&local_c0);
    std::filesystem::__cxx11::path::~path(&local_100);
  }
  local_c0._M_pathname._M_dataplus._M_p = local_c0._M_pathname._M_dataplus._M_p & 0xffffffff00000000
  ;
  ctx = (path *)local_98._8_8_;
  local_c0._M_pathname._M_string_length = sVar7;
  SmallVectorBase<std::filesystem::__cxx11::path>::reserve(this_00,local_98._8_8_);
  cVar4 = (char)(in_stack_fffffffffffffec8 >> 0x18);
  if ((path *)local_98._8_8_ != (path *)0x0) {
    lVar13 = local_98._8_8_ * 0x28;
    ppVar11 = (path *)local_98._0_8_;
    do {
      ctx = ppVar11;
      std::filesystem::weakly_canonical(&local_100,(error_code *)ppVar11);
      if ((int)local_c0._M_pathname._M_dataplus._M_p == 0) {
        ctx = &local_100;
        SmallVectorBase<std::filesystem::__cxx11::path>::
        emplace_back<std::filesystem::__cxx11::path>(this_00,&local_100);
      }
      std::filesystem::__cxx11::path::~path(&local_100);
      cVar4 = (char)(in_stack_fffffffffffffec8 >> 0x18);
      ppVar11 = ppVar11 + 1;
      lVar13 = lVar13 + -0x28;
    } while (lVar13 != 0);
  }
  if ((GVar6 != SimpleName) || (cVar4 != '\0')) goto LAB_001cbe55;
  GVar6 = ExactPath;
  if (this_00->len != 0) goto LAB_001cbe55;
  cVar4 = std::filesystem::__cxx11::path::has_root_path();
  if (cVar4 == '\0') {
    std::filesystem::__cxx11::operator/(&local_100,local_d8,(path *)local_128);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
               &local_100._M_pathname);
    _Var2._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         local_100._M_cmpts._M_impl._M_t.
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
    _Var1._M_head_impl = local_108._M_head_impl;
    local_100._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
            )0x0;
    local_108._M_head_impl =
         (_Impl *)_Var2._M_impl._M_t.
                  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                  _M_head_impl;
    if ((_Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>)_Var1._M_head_impl
        != (_Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>)0x0) {
      std::filesystem::__cxx11::path::_List::_Impl_deleter::operator()
                ((_Impl_deleter *)&local_108,_Var1._M_head_impl);
    }
    std::filesystem::__cxx11::path::clear(&local_100);
    std::filesystem::__cxx11::path::~path(&local_100);
  }
  ctx = ppVar12;
  cVar4 = std::filesystem::status((path *)local_128,(error_code *)ppVar12);
  if (*(int *)&(ppVar12->_M_pathname)._M_dataplus._M_p != 0) goto LAB_001cbe55;
  if (cVar4 == -1) {
    uVar10 = 2;
LAB_001cbe30:
    sVar7 = std::_V2::generic_category();
  }
  else {
    if (cVar4 == '\b') {
      uVar10 = 0xd;
      goto LAB_001cbe30;
    }
    if (cVar4 == '\x02') {
      uVar10 = 0x15;
      goto LAB_001cbe30;
    }
    sVar7 = std::_V2::generic_category();
    uVar10 = 0x5f;
    if (iVar9 == 1) {
      uVar10 = 0x14;
    }
  }
  *(undefined4 *)&(ppVar12->_M_pathname)._M_dataplus._M_p = uVar10;
  (ppVar12->_M_pathname)._M_string_length = sVar7;
  GVar6 = ExactPath;
LAB_001cbe55:
  SmallVectorBase<std::filesystem::__cxx11::path>::cleanup
            ((SmallVectorBase<std::filesystem::__cxx11::path> *)local_98,(EVP_PKEY_CTX *)ctx);
  std::filesystem::__cxx11::path::~path((path *)local_128);
  return GVar6;
}

Assistant:

SLANG_EXPORT GlobRank svGlob(const fs::path& basePath, std::string_view pattern, GlobMode mode,
                             SmallVector<fs::path>& results, bool expandEnvVars,
                             std::error_code& ec) {
    ec.clear();
    if (pattern == "-"sv && mode == GlobMode::Files) {
        // This is interpretted as trying to read stdin.
        results.emplace_back("-");
        return GlobRank::ExactPath;
    }

    fs::path patternPath;
    if (expandEnvVars) {
        std::string patternStr;
        patternStr.reserve(pattern.size());

        auto ptr = pattern.data();
        auto end = ptr + pattern.size();
        while (ptr != end) {
            char c = *ptr++;
            if (c == '$' && ptr != end)
                patternStr.append(OS::parseEnvVar(ptr, end));
            else
                patternStr.push_back(c);
        }

        patternPath = fs::path(patternStr);
    }
    else {
        patternPath = fs::path(pattern);
    }

    // Normalize the path to remove duplicate separators, figure out
    // whether we have an absolute path, etc.
    patternPath = patternPath.lexically_normal();

    SmallVector<fs::path> local;
    GlobRank rank;
    bool anyWildcards = false;
    if (patternPath.has_root_path()) {
        rank = svGlobInternal(patternPath.root_path(), getU8Str(patternPath.relative_path()), mode,
                              local, anyWildcards);
    }
    else {
        rank = svGlobInternal(basePath, getU8Str(patternPath), mode, local, anyWildcards);
    }

    // Results paths are always made canonical.
    std::error_code localEc;
    results.reserve(local.size());
    for (auto& p : local) {
        auto canonical = fs::weakly_canonical(p, localEc);
        if (!localEc)
            results.emplace_back(std::move(canonical));
    }

    if (!anyWildcards && rank == GlobRank::SimpleName) {
        // If there were no wildcards at all and we had a simple name match,
        // promote the rank to an exact path match.
        rank = GlobRank::ExactPath;
        if (results.empty()) {
            if (!patternPath.has_root_path())
                patternPath = basePath / patternPath;

            auto status = fs::status(patternPath, ec);
            if (!ec) {
                switch (status.type()) {
                    case fs::file_type::directory:
                        ec = make_error_code(std::errc::is_a_directory);
                        break;
                    case fs::file_type::not_found:
                        ec = make_error_code(std::errc::no_such_file_or_directory);
                        break;
                    case fs::file_type::unknown:
                        ec = make_error_code(std::errc::permission_denied);
                        break;
                    default:
                        if (mode == GlobMode::Directories)
                            ec = make_error_code(std::errc::not_a_directory);
                        else
                            ec = make_error_code(std::errc::not_supported);
                        break;
                }
            }
        }
    }

    return rank;
}